

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

vector<crnlib::adaptive_bit_model> * __thiscall
crnlib::vector<crnlib::adaptive_bit_model>::operator=
          (vector<crnlib::adaptive_bit_model> *this,vector<crnlib::adaptive_bit_model> *other)

{
  uint uVar1;
  adaptive_bit_model *paVar2;
  adaptive_bit_model *paVar3;
  long lVar4;
  
  if (this != other) {
    if (this->m_capacity < other->m_size) {
      clear(this);
      increase_capacity(this,other->m_size,false,false);
    }
    else {
      resize(this,0,false);
    }
    paVar2 = this->m_p;
    paVar3 = other->m_p;
    uVar1 = other->m_size;
    for (lVar4 = 0; uVar1 != (uint)lVar4; lVar4 = lVar4 + 1) {
      paVar2[lVar4].m_bit_0_prob = paVar3[lVar4].m_bit_0_prob;
    }
    this->m_size = uVar1;
  }
  return this;
}

Assistant:

inline vector& operator=(const vector& other)
        {
            if (this == &other)
            {
                return *this;
            }

            if (m_capacity >= other.m_size)
            {
                resize(0);
            }
            else
            {
                clear();
                increase_capacity(other.m_size, false);
            }

            if (CRNLIB_IS_BITWISE_COPYABLE(T))
            {
                memcpy(m_p, other.m_p, other.m_size * sizeof(T));
            }
            else
            {
                T* pDst = m_p;
                const T* pSrc = other.m_p;
                for (uint i = other.m_size; i > 0; i--)
                {
                    helpers::construct(pDst++, *pSrc++);
                }
            }

            m_size = other.m_size;

            return *this;
        }